

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O0

void __thiscall Task::Task(Task *this,proxy *proxy_info,curl_off_t start,curl_off_t end)

{
  curl_off_t end_local;
  curl_off_t start_local;
  proxy *proxy_info_local;
  Task *this_local;
  
  proxy::proxy(&this->proxy_server);
  std::thread::thread(&this->taskThread);
  this->task_id = global_task_id;
  global_task_id = global_task_id + 1;
  proxy::operator=(&this->proxy_server,proxy_info);
  this->start = start;
  this->end = end;
  this->download = 0;
  this->status = 0;
  this->speed = 0;
  return;
}

Assistant:

Task::Task(proxy proxy_info, curl_off_t start, curl_off_t end) {
    this->task_id = global_task_id;
    global_task_id++;
    this->proxy_server = proxy_info;
    this->start = start;
    this->end = end;
    download = 0;
    status = STATUS_CREATE;
    speed = 0;
}